

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O2

void tchecker::log_output_count(ostream *os)

{
  ostream *poVar1;
  bool bVar2;
  
  if (_log_error_count != 0) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::operator<<(poVar1," error(s)");
    if (_log_warning_count != 0 && _log_error_count != 0) {
      std::operator<<(os," and ");
    }
  }
  if (_log_warning_count == 0) {
    bVar2 = false;
  }
  else {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::operator<<(poVar1," warning(s)");
    bVar2 = _log_warning_count != 0;
  }
  if ((_log_error_count == 0) && (!bVar2)) {
    return;
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void log_output_count(std::ostream & os)
{
  if (tchecker::_log_error_count > 0)
    os << tchecker::_log_error_count << " error(s)";
  if (tchecker::_log_error_count > 0 && tchecker::_log_warning_count > 0)
    os << " and ";
  if (tchecker::_log_warning_count > 0)
    os << tchecker::_log_warning_count << " warning(s)";
  if (tchecker::_log_error_count > 0 || tchecker::_log_warning_count > 0)
    os << std::endl;
}